

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O3

void test_open_address_dictionary_handler_query_with_results(planck_unit_test_t *tc)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  ion_cursor_status_t iVar3;
  long *__s;
  ion_dict_cursor_t *cursor;
  ion_record_t record;
  ion_record_info_t record_info;
  ion_dictionary_t test_dictionary;
  ion_predicate_t predicate;
  ion_dictionary_handler_t map_handler;
  ion_dict_cursor_t *local_c8;
  ion_record_t local_c0;
  undefined4 local_ac;
  ion_record_info_t local_a8;
  ion_dictionary_t local_a0;
  ion_predicate_t local_88;
  ion_dictionary_handler_t local_68;
  
  local_a8.key_size = 4;
  local_a8.value_size = 10;
  createTestDictionary(&local_68,&local_a8,10,&local_a0,key_type_numeric_signed);
  local_ac = 1;
  dictionary_build_predicate(&local_88,'\0');
  iVar1 = dictionary_find(&local_a0,&local_88,&local_c8);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0xcd,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(local_c8->status == '\x02'),0xd0,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 != '\0') {
      local_c0.value = malloc(10);
      local_c0.key = malloc(4);
      iVar3 = (*local_c8->next)(local_c8,&local_c0);
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(iVar3 == '\x04'),0xd8,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        __s = (long *)malloc(10);
        sprintf((char *)__s,"value : %i",(ulong)*local_88.statement.range.lower_bound);
        pVar2 = planck_unit_assert_true
                          (tc,(uint)((short)*(long *)((long)local_c0.value + 8) == (short)__s[1] &&
                                    *local_c0.value == *__s),0xe0,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar2 != '\0') {
          free(__s);
          iVar3 = (*local_c8->next)(local_c8,&local_c0);
          pVar2 = planck_unit_assert_true
                            (tc,(uint)(iVar3 == '\x01'),0xe5,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar2 != '\0') {
            iVar3 = (*local_c8->next)(local_c8,&local_c0);
            pVar2 = planck_unit_assert_true
                              (tc,(uint)(iVar3 == '\x01'),0xe8,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                               ,"condition was false, expected true");
            if (pVar2 != '\0') {
              free(local_c0.value);
              free(local_c0.key);
              (*local_c8->destroy)(&local_c8);
              dictionary_delete_dictionary(&local_a0);
              return;
            }
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_dictionary_handler_query_with_results(
	planck_unit_test_t *tc
) {
	int					size;
	ion_record_info_t	record_info;

	/* this is required for initializing the hash map and should come from the dictionary */
	record_info.key_size	= sizeof(int);
	record_info.value_size	= 10;
	size					= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record_info, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t *cursor;	/* create a new cursor pointer */

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_equality, IONIZE(1, int));

	/* test that the query runs on dictionary instance okay */
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == dictionary_find(&test_dictionary, &predicate, &cursor));

	/* check the status of the cursor as it should be initialized */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_initialized == cursor->status);

	/* user must allocate memory before calling next() */
	ion_record_t record;

	record.value	= malloc(record_info.value_size);
	record.key		= malloc(record_info.key_size);

	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_active == cursor->next(cursor, &record));

	/* check that value is correct that has been returned */
	ion_value_t str;

	str = malloc(record_info.value_size);
	sprintf((char *) str, "value : %i", *(int *) predicate.statement.equality.equality_value);

	PLANCK_UNIT_ASSERT_TRUE(tc, ION_IS_EQUAL == memcmp(record.value, str, record_info.value_size));

	free(str);

	/* and as there is only 1 result, the next call should return empty */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_end_of_results == cursor->next(cursor, &record));

	/* and as there is only 1 result, the next call should return empty */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_end_of_results == cursor->next(cursor, &record));

	free(record.value);
	free(record.key);
	/* destory cursor for cleanup */
	cursor->destroy(&cursor);
	/* and destroy the dictionary instance */
	dictionary_delete_dictionary(&test_dictionary);
}